

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O0

void __thiscall pbrt::syntactic::Loc::Loc(Loc *this,Loc *param_2)

{
  shared_ptr<pbrt::syntactic::File> *in_RSI;
  shared_ptr<pbrt::syntactic::File> *in_RDI;
  
  std::shared_ptr<pbrt::syntactic::File>::shared_ptr(in_RSI,in_RDI);
  in_RDI[1].super___shared_ptr<pbrt::syntactic::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RSI[1].super___shared_ptr<pbrt::syntactic::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  return;
}

Assistant:

struct PBRT_PARSER_INTERFACE Loc {
      //! pretty-print
      std::string toString() const {
        return "@" + (file?file->getFileName():"<invalid>") + ":" + std::to_string(line) + "." + std::to_string(col);
      }

      std::shared_ptr<File> file;
      int line;
      int col;
    }